

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_test.cpp
# Opt level: O1

void __thiscall
vm_test_disassemble_prog_Test::vm_test_disassemble_prog_Test(vm_test_disassemble_prog_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_vm_test).super_Test._vptr_Test = (_func_int **)&PTR__vm_test_00184488;
  (this->super_vm_test).iset1.call_stack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_vm_test).iset1.call_stack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_vm_test).iset1.call_stack.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_vm_test).vm1.m_interpreter.m_iset = &(this->super_vm_test).iset1;
  *(undefined8 *)
   &(this->super_vm_test).vm1.m_interpreter.m_instances.
    super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>
    .super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>.
    super__Head_base<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_false>._M_head_impl.
    m_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl = 0;
  *(pointer *)
   ((long)&(this->super_vm_test).vm1.m_interpreter.m_instances.
           super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>
           .super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>.
           super__Head_base<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_false> + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_vm_test).vm1.m_interpreter.m_instances.
           super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>
           .super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>_>.
           super__Head_base<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_false> + 0x10)
       = (pointer)0x0;
  (this->super_vm_test).vm1.m_interpreter.m_rebased_ip.super_ip.m_val = 0;
  (this->super_vm_test).vm1.m_interpreter.m_rebased_ip.super_ip.m_base = 0;
  (this->super_vm_test).vm1.m_interpreter.m_rebased_ip.super_ip._vptr_ip =
       (_func_int **)&PTR__ip_00184508;
  (this->super_vm_test).vm1.m_interpreter.m_rebased_ip.m_max = 0;
  (this->super_vm_test).vm1.m_disassembler.m_rebased_ip.super_ip.m_val = 0;
  (this->super_vm_test).vm1.m_disassembler.m_rebased_ip.super_ip.m_base = 0;
  (this->super_vm_test).vm1.m_disassembler.m_rebased_ip.super_ip._vptr_ip =
       (_func_int **)&PTR__ip_00184508;
  (this->super_vm_test).vm1.m_disassembler.m_rebased_ip.m_max = 0;
  (this->super_vm_test).vm2.m_interpreter.m_iset =
       (instr_set_type *)&(this->super_vm_test).field_0x90;
  *(undefined8 *)
   &(this->super_vm_test).vm2.m_interpreter.m_instances.
    super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
    .
    super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
    .super__Tuple_impl<2UL,_mvm::value_stack<mvm::list::mplist<double>_>_>.
    super__Head_base<2UL,_mvm::value_stack<mvm::list::mplist<double>_>,_false>._M_head_impl.m_stack.
    super__Vector_base<double,_std::allocator<double>_> = 0;
  *(pointer *)
   ((long)&(this->super_vm_test).vm2.m_interpreter.m_instances.
           super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
           .
           super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
           .super__Tuple_impl<2UL,_mvm::value_stack<mvm::list::mplist<double>_>_> + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_vm_test).vm2.m_interpreter.m_instances.
           super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
           .
           super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
           .super__Tuple_impl<2UL,_mvm::value_stack<mvm::list::mplist<double>_>_> + 0x10) =
       (pointer)0x0;
  (this->super_vm_test).vm2.m_interpreter.m_instances.
  super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
  .
  super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
  .super__Head_base<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_false>._M_head_impl.
  m_stack.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_vm_test).vm2.m_interpreter.m_instances.
           super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
           .
           super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
           .super__Head_base<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_false> + 8) =
       (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_vm_test).vm2.m_interpreter.m_instances.
           super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
           .
           super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_mvm::value_stack<mvm::list::mplist<double>_>_>
           .super__Head_base<1UL,_mvm::value_stack<mvm::list::mplist<unsigned_int>_>,_false> + 0x10)
       = (pointer)0x0;
  (this->super_vm_test).vm2.m_interpreter.m_rebased_ip.super_ip.m_val = 0;
  (this->super_vm_test).vm2.m_interpreter.m_rebased_ip.super_ip.m_base = 0;
  (this->super_vm_test).vm2.m_interpreter.m_rebased_ip.super_ip._vptr_ip =
       (_func_int **)&PTR__ip_00184508;
  (this->super_vm_test).vm2.m_interpreter.m_rebased_ip.m_max = 0;
  (this->super_vm_test).vm2.m_disassembler.m_rebased_ip.super_ip.m_val = 0;
  (this->super_vm_test).vm2.m_disassembler.m_rebased_ip.super_ip.m_base = 0;
  (this->super_vm_test).vm2.m_disassembler.m_rebased_ip.super_ip._vptr_ip =
       (_func_int **)&PTR__ip_00184508;
  (this->super_vm_test).vm2.m_disassembler.m_rebased_ip.m_max = 0;
  (this->super_vm_test).vm3.m_interpreter.m_iset =
       (instr_set_type *)&(this->super_vm_test).field_0x118;
  *(undefined8 *)
   &(this->super_vm_test).vm3.m_interpreter.m_instances.
    super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>_>
    .super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>_>.
    super__Head_base<1UL,_mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>,_false>.
    _M_head_impl.m_stack.
    super__Vector_base<std::variant<double,_unsigned_int>,_std::allocator<std::variant<double,_unsigned_int>_>_>
    ._M_impl = 0;
  *(pointer *)
   ((long)&(this->super_vm_test).vm3.m_interpreter.m_instances.
           super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>_>
           .super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>_>.
           super__Head_base<1UL,_mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>,_false>
   + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_vm_test).vm3.m_interpreter.m_instances.
           super__Tuple_impl<0UL,_mvm::bytecode_serializer,_mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>_>
           .super__Tuple_impl<1UL,_mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>_>.
           super__Head_base<1UL,_mvm::value_stack<mvm::list::mplist<double,_unsigned_int>_>,_false>
   + 0x10) = (pointer)0x0;
  (this->super_vm_test).vm3.m_interpreter.m_rebased_ip.super_ip.m_val = 0;
  (this->super_vm_test).vm3.m_interpreter.m_rebased_ip.super_ip.m_base = 0;
  (this->super_vm_test).vm3.m_interpreter.m_rebased_ip.super_ip._vptr_ip =
       (_func_int **)&PTR__ip_00184508;
  (this->super_vm_test).vm3.m_interpreter.m_rebased_ip.m_max = 0;
  (this->super_vm_test).vm3.m_disassembler.m_rebased_ip.super_ip.m_val = 0;
  (this->super_vm_test).vm3.m_disassembler.m_rebased_ip.super_ip.m_base = 0;
  (this->super_vm_test).vm3.m_disassembler.m_rebased_ip.super_ip._vptr_ip =
       (_func_int **)&PTR__ip_00184508;
  (this->super_vm_test).vm3.m_disassembler.m_rebased_ip.m_max = 0;
  (this->super_vm_test).super_Test._vptr_Test = (_func_int **)&PTR__vm_test_001843d8;
  return;
}

Assistant:

TEST_F(vm_test, disassemble_prog) {
  std::string prog = "push 1\ndup\nzero\nrandn 2\nrotln 3\njump 23";
  std::istringstream sstr(prog);

  auto res = vm1.disassemble(std::get<1>(vm1.assemble(sstr)).value());
  EXPECT_EQ(std::get<0>(res), status_type::SUCCESS);
  EXPECT_TRUE(std::get<1>(res));
  EXPECT_EQ(std::get<1>(res).value(), prog + "\n");
}